

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.hpp
# Opt level: O1

Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> __thiscall
rc::shrinkable::walkPath<rc::detail::CaseDescription>
          (shrinkable *this,Shrinkable<rc::detail::CaseDescription> *shrinkable,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *path)

{
  size_t *psVar1;
  size_t index;
  char cVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  size_t *psVar4;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> MVar5;
  Shrinkable<rc::detail::CaseDescription> current;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> s;
  IShrinkableImpl *local_50;
  _Head_base<0UL,_rc::Seq<rc::Shrinkable<rc::detail::CaseDescription>_>::ISeqImpl_*,_false> local_48
  ;
  IShrinkableImpl *local_40;
  char local_38;
  undefined8 uVar3;
  
  local_50 = shrinkable->m_impl;
  (*local_50->_vptr_IShrinkableImpl[2])();
  psVar4 = (path->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (path->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      index = *psVar4;
      Shrinkable<rc::detail::CaseDescription>::shrinks
                ((Shrinkable<rc::detail::CaseDescription> *)&local_48);
      MVar5 = rc::seq::at<rc::Shrinkable<rc::detail::CaseDescription>>
                        ((seq *)&local_40,
                         (Seq<rc::Shrinkable<rc::detail::CaseDescription>_> *)&local_48,index);
      uVar3 = MVar5._8_8_;
      if (local_48._M_head_impl != (ISeqImpl *)0x0) {
        (*(local_48._M_head_impl)->_vptr_ISeqImpl[3])();
        uVar3 = extraout_RDX;
      }
      cVar2 = local_38;
      local_48._M_head_impl = (ISeqImpl *)0x0;
      if (local_38 == '\0') {
        this[8] = (shrinkable)0x0;
      }
      else {
        if (local_50 != (IShrinkableImpl *)0x0) {
          (*local_50->_vptr_IShrinkableImpl[3])();
          uVar3 = extraout_RDX_00;
        }
        local_50 = local_40;
        local_40 = (IShrinkableImpl *)0x0;
      }
      if ((local_38 == '\x01') && (local_40 != (IShrinkableImpl *)0x0)) {
        (*local_40->_vptr_IShrinkableImpl[3])();
        uVar3 = extraout_RDX_01;
      }
      if (cVar2 == '\0') goto LAB_00175c93;
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  this[8] = (shrinkable)0x0;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::reset
            ((Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> *)this);
  *(IShrinkableImpl **)this = local_50;
  local_50 = (IShrinkableImpl *)0x0;
  this[8] = (shrinkable)0x1;
  uVar3 = extraout_RDX_02;
LAB_00175c93:
  if (local_50 != (IShrinkableImpl *)0x0) {
    (*local_50->_vptr_IShrinkableImpl[3])();
    uVar3 = extraout_RDX_03;
  }
  MVar5._8_8_ = uVar3;
  MVar5.m_storage = (Storage)this;
  return MVar5;
}

Assistant:

Maybe<Shrinkable<T>> walkPath(const Shrinkable<T> &shrinkable,
                              const std::vector<std::size_t> &path) {
  auto current = shrinkable;
  for (const auto i : path) {
    auto s = seq::at(current.shrinks(), i);
    if (!s) {
      return Nothing;
    }
    current = std::move(*s);
  }

  return current;
}